

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O2

void __thiscall mocker::ir::Builder::operator()(Builder *this,IfStmt *node)

{
  FunctionModule *this_00;
  element_type *peVar1;
  BuilderContext *pBVar2;
  element_type *peVar3;
  bool bVar4;
  BBLIter BVar5;
  BBLIter BVar6;
  BBLIter val;
  BBLIter bblIter;
  shared_ptr<mocker::ir::Label> successorLabel;
  shared_ptr<mocker::ir::Jump> jump;
  shared_ptr<mocker::ir::Label> elseFirstLabel;
  shared_ptr<mocker::ir::Label> thenFirstLabel;
  __shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2> _Stack_a8;
  __shared_ptr<mocker::ir::Jump,_(__gnu_cxx::_Lock_policy)2> local_98;
  __shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2> local_88;
  _List_node_base *local_78;
  _List_node_base *local_70;
  BBLIter local_68;
  shared_ptr<mocker::ir::IRInst> local_60;
  shared_ptr<mocker::ir::IRInst> local_50;
  Builder local_40;
  
  BVar5 = BuilderContext::getCurBasicBlock(this->ctx);
  this_00 = this->ctx->curFunc;
  local_68 = BVar5;
  BVar6 = FunctionModule::insertBBAfter(this_00,BVar5);
  getBBLabel(&local_40,(const_iterator)BVar5._M_node);
  local_70 = BVar6._M_node;
  BuilderContext::setCurBasicBlock(this->ctx,BVar6);
  peVar1 = (node->then).super___shared_ptr<mocker::ast::Statement,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  (*(peVar1->super_ASTNode)._vptr_ASTNode[3])
            (peVar1,&this->field_0x0 + *(long *)(*(long *)this + -0xf0));
  BVar5 = BuilderContext::getCurBasicBlock(this->ctx);
  local_88._M_ptr = (element_type *)0x0;
  local_88._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if ((node->else_).super___shared_ptr<mocker::ast::Statement,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    bblIter._M_node = (_List_node_base *)0x0;
    val._M_node = (_List_node_base *)0x0;
    BVar6 = BVar5;
  }
  else {
    BVar6 = BVar5;
    val = FunctionModule::insertBBAfter(this_00,BVar5);
    getBBLabel((Builder *)&_Stack_a8,(const_iterator)BVar6._M_node);
    std::__shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&local_88,&_Stack_a8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_a8._M_refcount);
    BuilderContext::setCurBasicBlock(this->ctx,val);
    peVar1 = (node->else_).super___shared_ptr<mocker::ast::Statement,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    (*(peVar1->super_ASTNode)._vptr_ASTNode[3])
              (peVar1,&this->field_0x0 + *(long *)(*(long *)this + -0xf0));
    bblIter = BuilderContext::getCurBasicBlock(this->ctx);
    BVar6 = bblIter;
    if ((node->else_).super___shared_ptr<mocker::ast::Statement,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        == (element_type *)0x0) {
      BVar6 = BVar5;
    }
  }
  BVar6 = FunctionModule::insertBBAfter(this_00,BVar6);
  local_98._M_ptr = (element_type *)BVar6._M_node[1]._M_next;
  std::make_shared<mocker::ir::Label,unsigned_long>((unsigned_long *)&_Stack_a8);
  std::make_shared<mocker::ir::Jump,std::shared_ptr<mocker::ir::Label>&>
            ((shared_ptr<mocker::ir::Label> *)&local_98);
  bVar4 = BasicBlock::isCompleted((BasicBlock *)(BVar5._M_node + 1));
  if (!bVar4) {
    pBVar2 = this->ctx;
    local_78 = bblIter._M_node;
    std::__shared_ptr<mocker::ir::IRInst,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<mocker::ir::Jump,void>
              ((__shared_ptr<mocker::ir::IRInst,(__gnu_cxx::_Lock_policy)2> *)&local_50,&local_98);
    BuilderContext::appendInst(pBVar2,BVar5,&local_50);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_50.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    bblIter._M_node = local_78;
  }
  if (((node->else_).super___shared_ptr<mocker::ast::Statement,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       != (element_type *)0x0) &&
     (bVar4 = BasicBlock::isCompleted((BasicBlock *)(bblIter._M_node + 1)), !bVar4)) {
    pBVar2 = this->ctx;
    std::__shared_ptr<mocker::ir::IRInst,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<mocker::ir::Jump,void>
              ((__shared_ptr<mocker::ir::IRInst,(__gnu_cxx::_Lock_policy)2> *)&local_60,&local_98);
    BuilderContext::appendInst(pBVar2,bblIter,&local_60);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_60.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  pBVar2 = this->ctx;
  (pBVar2->logicalExprInfo).inCondition = true;
  (pBVar2->logicalExprInfo).trueNext._M_node = local_70;
  if ((node->else_).super___shared_ptr<mocker::ast::Statement,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    val = BVar6;
  }
  (pBVar2->logicalExprInfo).falseNext._M_node = val._M_node;
  (pBVar2->logicalExprInfo).empty = false;
  BuilderContext::setCurBasicBlock(this->ctx,local_68);
  peVar3 = (node->condition).super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  (*(peVar3->super_ASTNode)._vptr_ASTNode[3])
            (peVar3,&this->field_0x0 + *(long *)(*(long *)this + -0xf0));
  (pBVar2->logicalExprInfo).empty = true;
  (pBVar2->logicalExprInfo).inCondition = false;
  BuilderContext::setCurBasicBlock(this->ctx,BVar6);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_98._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_a8._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_88._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_40.ctx);
  return;
}

Assistant:

void Builder::operator()(const ast::IfStmt &node) const {
  auto originalBB = ctx.getCurBasicBlock();
  FunctionModule &func = ctx.getCurFunc();

  auto thenFirstBB = func.insertBBAfter(originalBB);
  auto thenFirstLabel = getBBLabel(thenFirstBB);
  ctx.setCurBasicBlock(thenFirstBB);
  visit(*node.then);
  auto thenLastBB = ctx.getCurBasicBlock();

  BBLIter elseFirstBB, elseLastBB;
  std::shared_ptr<Label> elseFirstLabel = nullptr;
  if (node.else_) {
    elseFirstBB = func.insertBBAfter(thenLastBB);
    elseFirstLabel = getBBLabel(elseFirstBB);
    ctx.setCurBasicBlock(elseFirstBB);
    visit(*node.else_);
    elseLastBB = ctx.getCurBasicBlock();
  }

  auto successorBB = func.insertBBAfter(node.else_ ? elseLastBB : thenLastBB);
  auto successorLabel = std::make_shared<Label>(successorBB->getLabelID());
  auto jump = std::make_shared<Jump>(successorLabel);
  if (!thenLastBB->isCompleted())
    ctx.appendInst(thenLastBB, jump);
  if (node.else_ && !elseLastBB->isCompleted())
    ctx.appendInst(elseLastBB, jump);

  auto &info = ctx.getLogicalExprInfo();
  info.inCondition = true;
  info.trueNext = thenFirstBB;
  info.falseNext = node.else_ ? elseFirstBB : successorBB;
  info.empty = false;
  ctx.setCurBasicBlock(originalBB);
  visit(*node.condition);
  info.empty = true;
  info.inCondition = false;

  ctx.setCurBasicBlock(successorBB);
}